

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O1

UINT8 nes_r_nsfplay(void *chip,UINT8 offset)

{
  _Bool _Var1;
  UINT8 readVal;
  UINT8 readVal_1;
  UINT8 local_1a;
  UINT8 local_19;
  
  if (offset < 0x20) {
    local_1a = '\0';
    NES_APU_np_Read(chip,offset | 0x4000,&local_1a);
    NES_DMC_np_Read(chip,offset | 0x4000,&local_1a);
  }
  else {
    local_1a = '\0';
    if ((*(void **)((long)chip + 0x18) != (void *)0x0) && (*(char *)((long)chip + 0x28) == '\0')) {
      _Var1 = NES_FDS_Read(*(void **)((long)chip + 0x18),offset | 0x4000,&local_19);
      local_1a = '\0';
      if (_Var1) {
        local_1a = local_19;
      }
    }
  }
  return local_1a;
}

Assistant:

static UINT8 nes_r_nsfplay(void* chip, UINT8 offset)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	if (offset < 0x20)	// NES APU
	{
		UINT8 readVal = 0x00;
		
		// the functions OR the result to the value
		NES_APU_np_Read(info, 0x4000 | offset, &readVal);
		NES_DMC_np_Read(info, 0x4000 | offset, &readVal);
		
		return readVal;
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			return nes_read_fds(info->chip_fds, offset);
#endif
		return 0x00;
	}
}